

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O2

void putagreytile(TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
                 int32_t fromskew,int32_t toskew,uchar *pp)

{
  ushort uVar1;
  uint32_t **ppuVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  uVar1 = img->samplesperpixel;
  ppuVar2 = img->BWmap;
  while (bVar5 = h != 0, h = h - 1, bVar5) {
    lVar4 = (long)toskew * -4;
    for (lVar3 = 0; w != (uint32_t)lVar3; lVar3 = lVar3 + 1) {
      cp[lVar3] = ((uint)pp[1] << 0x18 | 0xffffff) & *ppuVar2[*pp];
      pp = pp + uVar1;
      lVar4 = lVar4 + -4;
    }
    cp = (uint32_t *)((long)cp - lVar4);
    pp = pp + fromskew;
  }
  return;
}

Assistant:

DECLAREContigPutFunc(putagreytile)
{
    int samplesperpixel = img->samplesperpixel;
    uint32_t **BWmap = img->BWmap;

    (void)y;
    for (; h > 0; --h)
    {
        for (x = w; x > 0; --x)
        {
            *cp++ = BWmap[*pp][0] & ((uint32_t) * (pp + 1) << 24 | ~A1);
            pp += samplesperpixel;
        }
        cp += toskew;
        pp += fromskew;
    }
}